

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::calculate_ext_meshes(level_tools *this,size_t *vb_size,size_t *ib_size)

{
  cse_abstract *this_00;
  xr_ogf *pxVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  xr_level_spawn *pxVar5;
  vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_> *this_01;
  vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_> *this_02;
  reference ppcVar6;
  string *psVar7;
  reference ppxVar8;
  xr_ogf_vec *pxVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar10;
  undefined4 extraout_var_02;
  xr_ogf *ogf1;
  xr_ogf_vec_cit end1;
  xr_ogf_vec_cit it1;
  xr_ogf *ogf;
  cse_abstract *entity;
  xr_entity_vec_cit end;
  xr_entity_vec_cit it;
  xr_entity_vec *spawns;
  xr_ogf_vec_cit brkbl_it;
  size_t *ib_size_local;
  size_t *vb_size_local;
  level_tools *this_local;
  
  brkbl_it._M_current = (xr_ogf **)ib_size;
  pxVar5 = xray_re::xr_level::spawn(this->m_level);
  if (pxVar5 != (xr_level_spawn *)0x0) {
    this_01 = xray_re::xr_level::brkbl_meshes(this->m_level);
    spawns = (xr_entity_vec *)
             std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin(this_01);
    pxVar5 = xray_re::xr_level::spawn(this->m_level);
    this_02 = xray_re::xr_level_spawn::spawns(pxVar5);
    end._M_current =
         (cse_abstract **)
         std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::begin
                   (this_02);
    entity = (cse_abstract *)
             std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::end
                       (this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::cse_abstract_*const_*,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                                    *)&entity), bVar2) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<xray_re::cse_abstract_*const_*,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                ::operator*(&end);
      this_00 = *ppcVar6;
      psVar7 = xray_re::cse_abstract::name_abi_cxx11_(this_00);
      bVar2 = std::operator==(psVar7,"climable_object");
      if (bVar2) {
        *vb_size = *vb_size + 4;
        *brkbl_it._M_current =
             (xr_ogf *)
             ((long)&((*brkbl_it._M_current)->super_xr_object).super_xr_surface_factory.
                     _vptr_xr_surface_factory + 6);
      }
      else {
        psVar7 = xray_re::cse_abstract::name_abi_cxx11_(this_00);
        bVar2 = std::operator==(psVar7,"breakable_object");
        if (bVar2) {
          it1._M_current =
               (xr_ogf **)
               __gnu_cxx::
               __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
               ::operator++((__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                             *)&spawns,0);
          ppxVar8 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                    ::operator*(&it1);
          pxVar1 = *ppxVar8;
          uVar3 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x16])();
          if ((uVar3 & 1) == 0) {
            iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                      [0x1f])();
            sVar10 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_01,iVar4));
            *vb_size = sVar10 + *vb_size;
            iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                      [0x20])();
            sVar10 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_02,iVar4));
            *brkbl_it._M_current =
                 (xr_ogf *)
                 ((long)&((*brkbl_it._M_current)->super_xr_object).super_xr_surface_factory.
                         _vptr_xr_surface_factory + sVar10);
          }
          else {
            pxVar9 = xray_re::xr_ogf::children(pxVar1);
            end1._M_current =
                 (xr_ogf **)
                 std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin(pxVar9);
            pxVar9 = xray_re::xr_ogf::children(pxVar1);
            ogf1 = (xr_ogf *)
                   std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end(pxVar9);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&end1,(__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                             *)&ogf1), bVar2) {
              ppxVar8 = __gnu_cxx::
                        __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                        ::operator*(&end1);
              pxVar1 = *ppxVar8;
              iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x1f])();
              sVar10 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var,iVar4));
              *vb_size = sVar10 + *vb_size;
              iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x20])();
              sVar10 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_00,iVar4));
              *brkbl_it._M_current =
                   (xr_ogf *)
                   ((long)&((*brkbl_it._M_current)->super_xr_object).super_xr_surface_factory.
                           _vptr_xr_surface_factory + sVar10);
              __gnu_cxx::
              __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
              ::operator++(&end1);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<xray_re::cse_abstract_*const_*,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
      ::operator++(&end);
    }
  }
  return;
}

Assistant:

void level_tools::calculate_ext_meshes(size_t& vb_size, size_t& ib_size) const
{
	if (m_level->spawn() == 0)
		return;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();
	const xr_entity_vec& spawns = m_level->spawn()->spawns();
	for (xr_entity_vec_cit it = spawns.begin(), end = spawns.end(); it != end; ++it) {
		const cse_abstract* entity = *it;
		if (entity->name() == "climable_object") {
			vb_size += 4;
			ib_size += 6;
		} else if (entity->name() == "breakable_object") {
			const xr_ogf* ogf = *brkbl_it++;
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = *it1;
					vb_size += ogf1->vb().size();
					ib_size += ogf1->ib().size();
				}
			} else {
				vb_size += ogf->vb().size();
				ib_size += ogf->ib().size();
			}
		}
	}
}